

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::isDebuggerActive(void)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ulong uVar4;
  char *pcVar5;
  string line;
  ifstream in;
  ErrnoGuard guard;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  int local_244;
  string local_240 [48];
  istream local_210 [527];
  byte local_1;
  
  ErrnoGuard::ErrnoGuard
            ((ErrnoGuard *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  std::ifstream::ifstream(local_210,"/proc/self/status",_S_in);
  std::__cxx11::string::string(local_240);
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_210,local_240);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      local_244 = 2;
      goto LAB_0012612b;
    }
    iVar2 = std::__cxx11::string::compare((ulong)local_240,0,(char *)0xb);
  } while (iVar2 != 0);
  uVar4 = std::__cxx11::string::length();
  in_stack_fffffffffffffda7 = false;
  if (0xb < uVar4) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_240);
    in_stack_fffffffffffffda7 = *pcVar5 != '0';
  }
  local_244 = 1;
  local_1 = in_stack_fffffffffffffda7;
LAB_0012612b:
  std::__cxx11::string::~string(local_240);
  if (local_244 == 2) {
    local_1 = 0;
  }
  std::ifstream::~ifstream(local_210);
  ErrnoGuard::~ErrnoGuard
            ((ErrnoGuard *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
  return (bool)(local_1 & 1);
}

Assistant:

bool isDebuggerActive(){
            // Libstdc++ has a bug, where std::ifstream sets errno to 0
            // This way our users can properly assert over errno values
            ErrnoGuard guard;
            std::ifstream in("/proc/self/status");
            for( std::string line; std::getline(in, line); ) {
                static const int PREFIX_LEN = 11;
                if( line.compare(0, PREFIX_LEN, "TracerPid:\t") == 0 ) {
                    // We're traced if the PID is not 0 and no other PID starts
                    // with 0 digit, so it's enough to check for just a single
                    // character.
                    return line.length() > PREFIX_LEN && line[PREFIX_LEN] != '0';
                }
            }

            return false;
        }